

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::pls_decl_abi_cxx11_(CompilerGLSL *this,PlsRemap *var)

{
  uint32_t uVar1;
  uint32_t *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8 [32];
  char *local_198;
  char *local_190 [3];
  undefined1 local_178 [8];
  SPIRType type;
  SPIRVariable *variable;
  PlsRemap *var_local;
  CompilerGLSL *this_local;
  
  type.member_name_cache._M_h._M_single_bucket =
       (__node_base_ptr)Compiler::get<spirv_cross::SPIRVariable>((Compiler *)var,*in_RDX);
  SPIRType::SPIRType((SPIRType *)local_178);
  type.super_IVariant._12_4_ = pls_format_to_components(in_RDX[1]);
  type.super_IVariant._vptr_IVariant._4_4_ = pls_format_to_basetype(in_RDX[1]);
  local_190[0] = to_pls_layout(in_RDX[1]);
  local_198 = to_pls_qualifiers_glsl
                        ((CompilerGLSL *)var,
                         (SPIRVariable *)type.member_name_cache._M_h._M_single_bucket);
  (**(code **)((long)*var + 0x98))(local_1b8,var,local_178,0);
  uVar1 = TypedID::operator_cast_to_unsigned_int
                    ((TypedID *)(type.member_name_cache._M_h._M_single_bucket + 1));
  (**(code **)((long)*var + 0x30))(local_1d8,var,uVar1,1);
  join<char_const*,char_const*,std::__cxx11::string,char_const(&)[2],std::__cxx11::string>
            ((spirv_cross *)this,local_190,&local_198,local_1b8,(char (*) [2])0x4e078e,local_1d8);
  ::std::__cxx11::string::~string((string *)local_1d8);
  ::std::__cxx11::string::~string((string *)local_1b8);
  SPIRType::~SPIRType((SPIRType *)local_178);
  return this;
}

Assistant:

string CompilerGLSL::pls_decl(const PlsRemap &var)
{
	auto &variable = get<SPIRVariable>(var.id);

	SPIRType type;
	type.vecsize = pls_format_to_components(var.format);
	type.basetype = pls_format_to_basetype(var.format);

	return join(to_pls_layout(var.format), to_pls_qualifiers_glsl(variable), type_to_glsl(type), " ",
	            to_name(variable.self));
}